

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode socket_set_nonblocking(int sockfd)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fcntl(sockfd,3);
  if ((int)uVar1 < 0) {
    uVar1 = 0x80020000;
  }
  else {
    iVar2 = fcntl(sockfd,4,(ulong)(uVar1 | 0x800));
    uVar1 = iVar2 >> 0x1f & 0x80020000;
  }
  return uVar1;
}

Assistant:

static UA_StatusCode socket_set_nonblocking(SOCKET sockfd) {
#ifdef _WIN32
    u_long iMode = 1;
    if(ioctlsocket(sockfd, FIONBIO, &iMode) != NO_ERROR)
        return UA_STATUSCODE_BADINTERNALERROR;
#else
    int opts = fcntl(sockfd, F_GETFL);
    if(opts < 0 || fcntl(sockfd, F_SETFL, opts|O_NONBLOCK) < 0)
        return UA_STATUSCODE_BADINTERNALERROR;
#endif
    return UA_STATUSCODE_GOOD;
}